

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

char * __thiscall asmjit::v1_14::String::prepare(String *this,ModifyOp op,size_t size)

{
  ulong uVar1;
  size_t __size;
  void *__dest;
  ulong in_RDX;
  int in_ESI;
  String *in_RDI;
  char *newData_1;
  size_t newCapacityPlusOne;
  size_t newSizePlusOne;
  size_t newSize;
  char *newData;
  size_t newCapacity;
  size_t curCapacity;
  size_t curSize;
  char *curData;
  char *in_stack_00000370;
  int in_stack_0000037c;
  char *in_stack_00000380;
  size_t in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  ulong local_50;
  size_t local_48;
  String *local_40;
  String *local_20;
  
  if ((byte)*in_RDI < 0x1f) {
    local_40 = in_RDI + 1;
    local_48 = (size_t)(byte)*in_RDI;
    local_50 = 0x1e;
  }
  else {
    local_40 = *(String **)(in_RDI + 0x18);
    local_48 = *(size_t *)(in_RDI + 8);
    local_50 = *(ulong *)(in_RDI + 0x10);
  }
  if (in_ESI == 0) {
    if (local_50 < in_RDX) {
      if (in_RDX < 0xfffffffffeffffff) {
        uVar1 = in_RDX + 0x80 & 0xffffffffffffff80;
        local_20 = (String *)malloc(uVar1);
        if (local_20 == (String *)0x0) {
          local_20 = (String *)0x0;
        }
        else {
          if (*in_RDI == (String)0x1f) {
            free(local_40);
          }
          *in_RDI = (String)0x1f;
          *(ulong *)(in_RDI + 8) = in_RDX;
          *(ulong *)(in_RDI + 0x10) = uVar1 - 1;
          *(String **)(in_RDI + 0x18) = local_20;
          local_20[in_RDX] = (String)0x0;
        }
      }
      else {
        local_20 = (String *)0x0;
      }
    }
    else {
      _setSize(in_RDI,in_RDX);
      local_40[in_RDX] = (String)0x0;
      local_20 = local_40;
    }
  }
  else if (in_RDX < 0xfffffffffefffffe - local_48) {
    uVar1 = in_RDX + local_48;
    if (local_50 < uVar1) {
      __size = String_growCapacity(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      if (__size < uVar1 + 1) {
        DebugUtils::assertionFailed(in_stack_00000380,in_stack_0000037c,in_stack_00000370);
      }
      if (__size < uVar1 + 1) {
        local_20 = (String *)0x0;
      }
      else {
        __dest = malloc(__size);
        if (__dest == (void *)0x0) {
          local_20 = (String *)0x0;
        }
        else {
          memcpy(__dest,local_40,local_48);
          if (*in_RDI == (String)0x1f) {
            free(local_40);
          }
          *in_RDI = (String)0x1f;
          *(ulong *)(in_RDI + 8) = uVar1;
          *(size_t *)(in_RDI + 0x10) = __size - 1;
          *(void **)(in_RDI + 0x18) = __dest;
          *(undefined1 *)((long)__dest + uVar1) = 0;
          local_20 = (String *)((long)__dest + local_48);
        }
      }
    }
    else {
      _setSize(in_RDI,uVar1);
      local_40[uVar1] = (String)0x0;
      local_20 = local_40 + local_48;
    }
  }
  else {
    local_20 = (String *)0x0;
  }
  return (char *)local_20;
}

Assistant:

char* String::prepare(ModifyOp op, size_t size) noexcept {
  char* curData;
  size_t curSize;
  size_t curCapacity;

  if (isLargeOrExternal()) {
    curData = _large.data;
    curSize = _large.size;
    curCapacity = _large.capacity;
  }
  else {
    curData = _small.data;
    curSize = _small.type;
    curCapacity = kSSOCapacity;
  }

  if (op == ModifyOp::kAssign) {
    if (size > curCapacity) {
      // Prevent arithmetic overflow.
      if (ASMJIT_UNLIKELY(size >= kMaxAllocSize))
        return nullptr;

      size_t newCapacity = Support::alignUp<size_t>(size + 1, kMinAllocSize);
      char* newData = static_cast<char*>(::malloc(newCapacity));

      if (ASMJIT_UNLIKELY(!newData))
        return nullptr;

      if (_type == kTypeLarge)
        ::free(curData);

      _large.type = kTypeLarge;
      _large.size = size;
      _large.capacity = newCapacity - 1;
      _large.data = newData;

      newData[size] = '\0';
      return newData;
    }
    else {
      _setSize(size);
      curData[size] = '\0';
      return curData;
    }
  }
  else {
    // Prevent arithmetic overflow.
    if (ASMJIT_UNLIKELY(size >= kMaxAllocSize - curSize - 1))
      return nullptr;

    size_t newSize = size + curSize;
    size_t newSizePlusOne = newSize + 1;

    if (newSize > curCapacity) {
      size_t newCapacityPlusOne = String_growCapacity(size + 1u, newSizePlusOne);
      ASMJIT_ASSERT(newCapacityPlusOne >= newSizePlusOne);

      if (ASMJIT_UNLIKELY(newCapacityPlusOne < newSizePlusOne))
        return nullptr;

      char* newData = static_cast<char*>(::malloc(newCapacityPlusOne));
      if (ASMJIT_UNLIKELY(!newData))
        return nullptr;

      memcpy(newData, curData, curSize);

      if (_type == kTypeLarge)
        ::free(curData);

      _large.type = kTypeLarge;
      _large.size = newSize;
      _large.capacity = newCapacityPlusOne - 1;
      _large.data = newData;

      newData[newSize] = '\0';
      return newData + curSize;
    }
    else {
      _setSize(newSize);
      curData[newSize] = '\0';
      return curData + curSize;
    }
  }
}